

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBad.cpp
# Opt level: O0

void __thiscall L12_1::StringBad::~StringBad(StringBad *this)

{
  ostream *poVar1;
  StringBad *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\"");
  poVar1 = std::operator<<(poVar1,this->str);
  poVar1 = std::operator<<(poVar1,"\" object deleted. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,num_strings + -1);
  std::operator<<(poVar1," left.\n");
  num_strings = num_strings + -1;
  if (this->str != (char *)0x0) {
    operator_delete__(this->str);
  }
  return;
}

Assistant:

StringBad::~StringBad() {
        std::cout << "\"" << str << "\" object deleted. " << num_strings - 1 << " left.\n";
        num_strings--;
        //  清掉动态分配的内存
        delete [] str;
    }